

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O0

Elf_Xword __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::get_entries_num
          (dynamic_section_accessor_template<ELFIO::section> *this)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  unsigned_long *puVar4;
  unsigned_long local_68 [3];
  undefined1 local_50 [8];
  string str;
  Elf_Xword value;
  Elf_Xword tag;
  Elf_Xword i;
  size_t needed_entry_size;
  dynamic_section_accessor_template<ELFIO::section> *this_local;
  
  i = 0xffffffffffffffff;
  needed_entry_size = (size_t)this;
  uVar1 = elfio::get_class(this->elf_file);
  if (uVar1 == '\x01') {
    i = 8;
  }
  else {
    i = 0x10;
  }
  if (((this->entries_num == 0) &&
      (iVar2 = (*this->dynamic_section->_vptr_section[0xf])(), CONCAT44(extraout_var,iVar2) != 0))
     && (iVar2 = (*this->dynamic_section->_vptr_section[0xf])(),
        i <= CONCAT44(extraout_var_00,iVar2))) {
    iVar2 = (*this->dynamic_section->_vptr_section[0x13])();
    iVar3 = (*this->dynamic_section->_vptr_section[0xf])();
    this->entries_num = CONCAT44(extraout_var_01,iVar2) / CONCAT44(extraout_var_02,iVar3);
    value = 0;
    str.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)local_50);
    tag = 0;
    while ((tag < this->entries_num &&
           (get_entry(this,tag,&value,(Elf_Xword *)(str.field_2._M_local_buf + 8),(string *)local_50
                     ), value != 0))) {
      tag = tag + 1;
    }
    local_68[0] = tag + 1;
    puVar4 = std::min<unsigned_long>(&this->entries_num,local_68);
    this->entries_num = *puVar4;
    std::__cxx11::string::~string((string *)local_50);
  }
  return this->entries_num;
}

Assistant:

Elf_Xword get_entries_num() const
    {
        size_t needed_entry_size = -1;
        if ( elf_file.get_class() == ELFCLASS32 ) {
            needed_entry_size = sizeof( Elf32_Dyn );
        }
        else {
            needed_entry_size = sizeof( Elf64_Dyn );
        }

        if ( ( 0 == entries_num ) &&
             ( 0 != dynamic_section->get_entry_size() &&
               dynamic_section->get_entry_size() >= needed_entry_size ) ) {
            entries_num =
                dynamic_section->get_size() / dynamic_section->get_entry_size();
            Elf_Xword   i;
            Elf_Xword   tag   = DT_NULL;
            Elf_Xword   value = 0;
            std::string str;
            for ( i = 0; i < entries_num; i++ ) {
                get_entry( i, tag, value, str );
                if ( tag == DT_NULL )
                    break;
            }
            entries_num = std::min<Elf_Xword>( entries_num, i + 1 );
        }

        return entries_num;
    }